

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O0

IrrlichtDevice * createDeviceEx(SIrrlichtCreationParameters *params)

{
  int iVar1;
  undefined4 extraout_var;
  int *in_RDI;
  IrrlichtDevice *dev;
  SIrrlichtCreationParameters *in_stack_00000038;
  CIrrDeviceSDL *in_stack_00000040;
  IReferenceCounted *in_stack_ffffffffffffffe8;
  IReferenceCounted *local_10;
  
  local_10 = (IReferenceCounted *)0x0;
  if ((*in_RDI == 3) || (*in_RDI == 4)) {
    in_stack_ffffffffffffffe8 = (IReferenceCounted *)operator_new(0x1e0);
    irr::CIrrDeviceSDL::CIrrDeviceSDL(in_stack_00000040,in_stack_00000038);
    local_10 = in_stack_ffffffffffffffe8;
  }
  if (((local_10 != (IReferenceCounted *)0x0) &&
      (iVar1 = (*local_10->_vptr_IReferenceCounted[3])(), CONCAT44(extraout_var,iVar1) == 0)) &&
     (in_RDI[1] != 0)) {
    (*local_10->_vptr_IReferenceCounted[0x15])();
    (**local_10->_vptr_IReferenceCounted)();
    irr::IReferenceCounted::drop(in_stack_ffffffffffffffe8);
    local_10 = (IReferenceCounted *)0x0;
  }
  return (IrrlichtDevice *)local_10;
}

Assistant:

createDeviceEx(const SIrrlichtCreationParameters &params)
{

	IrrlichtDevice *dev = 0;

#ifdef _IRR_COMPILE_WITH_WINDOWS_DEVICE_
	if (params.DeviceType == EIDT_WIN32 || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceWin32(params);
#endif

#ifdef _IRR_COMPILE_WITH_OSX_DEVICE_
	if (params.DeviceType == EIDT_OSX || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceMacOSX(params);
#endif

#ifdef _IRR_COMPILE_WITH_X11_DEVICE_
	if (params.DeviceType == EIDT_X11 || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceLinux(params);
#endif

#ifdef _IRR_COMPILE_WITH_ANDROID_DEVICE_
	if (params.DeviceType == EIDT_ANDROID || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceAndroid(params);
#endif

#ifdef _IRR_COMPILE_WITH_SDL_DEVICE_
	if (params.DeviceType == EIDT_SDL || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceSDL(params);
#endif

	if (dev && !dev->getVideoDriver() && params.DriverType != video::EDT_NULL) {
		dev->closeDevice(); // destroy window
		dev->run();         // consume quit message
		dev->drop();
		dev = 0;
	}

	return dev;
}